

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElementType::IfcTransportElementType
          (IfcTransportElementType *this)

{
  IfcTransportElementType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1b0,"IfcTransportElementType");
  IfcElementType::IfcElementType(&this->super_IfcElementType,&PTR_construction_vtable_24__00ff3648);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTransportElementType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTransportElementType,_1UL> *)
             &(this->super_IfcElementType).field_0x180,&PTR_construction_vtable_24__00ff3738);
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = 0xff3540;
  *(undefined8 *)&this->field_0x1b0 = 0xff3630;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       0xff3568;
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xff3590;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       0xff35b8;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 = 0xff35e0;
  *(undefined8 *)&(this->super_IfcElementType).field_0x180 = 0xff3608;
  std::__cxx11::string::string((string *)&(this->super_IfcElementType).field_0x190);
  return;
}

Assistant:

IfcTransportElementType() : Object("IfcTransportElementType") {}